

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O0

void swrenderer::R_SetupColormap(player_t *player)

{
  short sVar1;
  bool bVar2;
  uint uVar3;
  FSpecialColormap *pFVar4;
  player_t *player_local;
  
  realfixedcolormap = (FSpecialColormap *)0x0;
  fixedcolormap = (BYTE *)0x0;
  fixedlightlev = -1;
  if ((player != (player_t *)0x0) && ((APlayerPawn *)camera == player->mo)) {
    if ((player->fixedcolormap < 0) ||
       (sVar1 = player->fixedcolormap,
       uVar3 = TArray<FSpecialColormap,_FSpecialColormap>::Size(&SpecialColormaps),
       (int)uVar3 <= (int)sVar1)) {
      if ((-1 < player->fixedlightlevel) && (player->fixedlightlevel < 0x20)) {
        fixedlightlev = (int)player->fixedlightlevel << 8;
        bVar2 = FBoolCVar::operator_cast_to_bool(&r_fullbrightignoresectorcolor);
        if ((bVar2) && (-1 < fixedlightlev)) {
          fixedcolormap = FullNormalLight.Maps;
        }
      }
    }
    else {
      realfixedcolormap =
           TArray<FSpecialColormap,_FSpecialColormap>::operator[]
                     (&SpecialColormaps,(long)player->fixedcolormap);
      if ((((DFrameBuffer *)RenderTarget == screen) && ((screen->Accel2D & 1U) != 0)) &&
         (bVar2 = FBoolCVar::operator_cast_to_bool(&r_shadercolormaps), bVar2)) {
        fixedcolormap = realcolormaps;
      }
      else {
        pFVar4 = TArray<FSpecialColormap,_FSpecialColormap>::operator[]
                           (&SpecialColormaps,(long)player->fixedcolormap);
        fixedcolormap = pFVar4->Colormap;
      }
    }
  }
  if ((fixedcolormap == (BYTE *)0x0) && (extralight == -0x80000000)) {
    pFVar4 = TArray<FSpecialColormap,_FSpecialColormap>::operator[](&SpecialColormaps,0);
    fixedcolormap = pFVar4->Colormap;
    extralight = 0;
  }
  return;
}

Assistant:

void R_SetupColormap(player_t *player)
{
	realfixedcolormap = NULL;
	fixedcolormap = NULL;
	fixedlightlev = -1;

	if (player != NULL && camera == player->mo)
	{
		if (player->fixedcolormap >= 0 && player->fixedcolormap < (int)SpecialColormaps.Size())
		{
			realfixedcolormap = &SpecialColormaps[player->fixedcolormap];
			if (RenderTarget == screen && (DFrameBuffer *)screen->Accel2D && r_shadercolormaps)
			{
				// Render everything fullbright. The copy to video memory will
				// apply the special colormap, so it won't be restricted to the
				// palette.
				fixedcolormap = realcolormaps;
			}
			else
			{
				fixedcolormap = SpecialColormaps[player->fixedcolormap].Colormap;
			}
		}
		else if (player->fixedlightlevel >= 0 && player->fixedlightlevel < NUMCOLORMAPS)
		{
			fixedlightlev = player->fixedlightlevel * 256;
			// [SP] Emulate GZDoom's light-amp goggles.
			if (r_fullbrightignoresectorcolor && fixedlightlev >= 0)
			{
				fixedcolormap = FullNormalLight.Maps;
			}
		}
	}
	// [RH] Inverse light for shooting the Sigil
	if (fixedcolormap == NULL && extralight == INT_MIN)
	{
		fixedcolormap = SpecialColormaps[INVERSECOLORMAP].Colormap;
		extralight = 0;
	}
}